

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  bool bVar1;
  byte in_DIL;
  bool term_supports_color;
  char *term;
  char *gtest_color;
  string c;
  char *in_stack_ffffffffffffff88;
  bool local_6c;
  bool local_6a;
  bool local_69;
  string local_28 [38];
  byte local_2;
  bool local_1;
  
  local_2 = in_DIL & 1;
  std::__cxx11::string::string(local_28,(string *)FLAGS_gtest_color_abi_cxx11_);
  std::__cxx11::string::c_str();
  bVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffff88,(char *)0xb420f3);
  if (bVar1) {
    posix::GetEnv((char *)0xb42112);
    bVar1 = String::CStringEquals(in_stack_ffffffffffffff88,(char *)0xb42134);
    local_69 = true;
    if (!bVar1) {
      bVar1 = String::CStringEquals(in_stack_ffffffffffffff88,(char *)0xb42156);
      local_69 = true;
      if (!bVar1) {
        bVar1 = String::CStringEquals(in_stack_ffffffffffffff88,(char *)0xb42178);
        local_69 = true;
        if (!bVar1) {
          bVar1 = String::CStringEquals(in_stack_ffffffffffffff88,(char *)0xb4219a);
          local_69 = true;
          if (!bVar1) {
            bVar1 = String::CStringEquals(in_stack_ffffffffffffff88,(char *)0xb421bc);
            local_69 = true;
            if (!bVar1) {
              bVar1 = String::CStringEquals(in_stack_ffffffffffffff88,(char *)0xb421de);
              local_69 = true;
              if (!bVar1) {
                bVar1 = String::CStringEquals(in_stack_ffffffffffffff88,(char *)0xb42200);
                local_69 = true;
                if (!bVar1) {
                  bVar1 = String::CStringEquals(in_stack_ffffffffffffff88,(char *)0xb4221e);
                  local_69 = true;
                  if (!bVar1) {
                    bVar1 = String::CStringEquals(in_stack_ffffffffffffff88,(char *)0xb4223c);
                    local_69 = true;
                    if (!bVar1) {
                      bVar1 = String::CStringEquals(in_stack_ffffffffffffff88,(char *)0xb4225a);
                      local_69 = true;
                      if (!bVar1) {
                        local_69 = String::CStringEquals(in_stack_ffffffffffffff88,(char *)0xb42278)
                        ;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_6a = false;
    if ((local_2 & 1) != 0) {
      local_6a = local_69;
    }
    local_1 = local_6a;
  }
  else {
    bVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffff88,(char *)0xb422e0);
    local_6c = true;
    if (!bVar1) {
      bVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffff88,(char *)0xb42308);
      local_6c = true;
      if (!bVar1) {
        bVar1 = String::CaseInsensitiveCStringEquals(in_stack_ffffffffffffff88,(char *)0xb42330);
        local_6c = true;
        if (!bVar1) {
          local_6c = String::CStringEquals(in_stack_ffffffffffffff88,(char *)0xb42358);
        }
      }
    }
    local_1 = local_6c;
  }
  std::__cxx11::string::~string(local_28);
  return (bool)(local_1 & 1);
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  std::string c = GTEST_FLAG_GET(color);
  const char* const gtest_color = c.c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MINGW
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        String::CStringEquals(term, "xterm") ||
        String::CStringEquals(term, "xterm-color") ||
        String::CStringEquals(term, "xterm-256color") ||
        String::CStringEquals(term, "screen") ||
        String::CStringEquals(term, "screen-256color") ||
        String::CStringEquals(term, "tmux") ||
        String::CStringEquals(term, "tmux-256color") ||
        String::CStringEquals(term, "rxvt-unicode") ||
        String::CStringEquals(term, "rxvt-unicode-256color") ||
        String::CStringEquals(term, "linux") ||
        String::CStringEquals(term, "cygwin");
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
         String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}